

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_EAX;
  ulong uVar4;
  secp256k1_gej *r;
  ulong uVar5;
  secp256k1_fe *a;
  char *extraout_RDX;
  secp256k1_gej *psVar6;
  secp256k1_gej *r_00;
  ulong uVar7;
  ulong uVar8;
  secp256k1_fe *a_00;
  secp256k1_ecdsa_signature *sig;
  ulong uVar9;
  secp256k1_ge *r_01;
  secp256k1_context *ctx;
  ulong in_R8;
  long lVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  secp256k1_fe *psVar15;
  secp256k1_fe *psVar16;
  secp256k1_gej *r_02;
  undefined1 auVar17 [16];
  secp256k1_fe s;
  secp256k1_fe u1;
  secp256k1_fe d;
  secp256k1_fe g;
  uchar auStack_3f0 [72];
  secp256k1_gej *psStack_3a8;
  secp256k1_fe *psStack_3a0;
  secp256k1_gej *psStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  code *pcStack_380;
  secp256k1_gej *psStack_378;
  secp256k1_gej *psStack_368;
  secp256k1_gej *psStack_358;
  undefined1 auStack_350 [104];
  uint64_t uStack_2e8;
  uint64_t uStack_2e0;
  uint64_t uStack_2d8;
  uint64_t uStack_2d0;
  int iStack_2c8;
  int iStack_2c4;
  secp256k1_fe sStack_290;
  int iStack_260;
  secp256k1_ge sStack_250;
  secp256k1_gej *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  code *pcStack_1c0;
  secp256k1_gej *local_1b0;
  undefined1 local_1a8 [56];
  uint64_t uStack_170;
  uint64_t local_168;
  uint64_t uStack_160;
  uint64_t local_158;
  int iStack_150;
  int iStack_14c;
  secp256k1_fe local_148;
  secp256k1_fe local_118;
  secp256k1_fe local_e8;
  uint64_t local_b8;
  uint64_t uStack_b0;
  uint64_t local_a8;
  uint64_t uStack_a0;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  psVar16 = (secp256k1_fe *)0xf000000000000;
  local_118.n[0] = u->n[0];
  local_118.n[1] = u->n[1];
  local_118.n[2] = u->n[2];
  local_118.n[3] = u->n[3];
  local_118.n[4] = u->n[4];
  local_118.magnitude = u->magnitude;
  local_118.normalized = u->normalized;
  pcStack_1c0 = (code *)0x1207dc;
  local_1b0 = (secp256k1_gej *)xn;
  secp256k1_fe_verify(&local_118);
  psVar6 = (secp256k1_gej *)0x1000003d1;
  uVar4 = (local_118.n[4] >> 0x30) * 0x1000003d1 + local_118.n[0];
  psVar15 = (secp256k1_fe *)0xffffefffffc2f;
  if (((uVar4 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar4 & 0xfffffffffffff) == 0)) {
    uVar5 = (uVar4 >> 0x34) + local_118.n[1];
    uVar7 = (uVar5 >> 0x34) + local_118.n[2];
    uVar9 = (uVar7 >> 0x34) + local_118.n[3];
    in_R8 = (uVar9 >> 0x34) + (local_118.n[4] & 0xffffffffffff);
    if (((uVar5 | uVar4 | uVar7 | uVar9) & 0xfffffffffffff) == 0 && in_R8 == 0) goto LAB_00120f22;
    in_R8 = in_R8 ^ 0xf000000000000;
    if (((uVar4 | 0x1000003d0) & uVar5 & uVar7 & uVar9 & in_R8) == 0xfffffffffffff)
    goto LAB_00120f22;
  }
  while( true ) {
    pcStack_1c0 = (code *)0x12089f;
    secp256k1_fe_sqr(&local_148,t);
    pcStack_1c0 = (code *)0x1208a7;
    secp256k1_fe_verify(t);
    uVar4 = (t->n[4] >> 0x30) * 0x1000003d1 + t->n[0];
    if (((secp256k1_fe *)(uVar4 & 0xfffffffffffff) == psVar15) ||
       ((secp256k1_fe *)(uVar4 & 0xfffffffffffff) == (secp256k1_fe *)0x0)) {
      uVar5 = (uVar4 >> 0x34) + t->n[1];
      uVar7 = (uVar5 >> 0x34) + t->n[2];
      uVar9 = (uVar7 >> 0x34) + t->n[3];
      in_R8 = (uVar9 >> 0x34) + (t->n[4] & 0xffffffffffff);
      if ((((uVar5 | uVar4 | uVar7 | uVar9) & 0xfffffffffffff) == 0 && in_R8 == 0) ||
         (in_R8 = in_R8 ^ (ulong)psVar16,
         ((uVar4 | 0x1000003d0) & uVar5 & uVar7 & uVar9 & in_R8) == 0xfffffffffffff)) {
        local_148.n[4] = 0;
        local_148.magnitude = 1;
        local_148.normalized = 1;
        local_148.n[2] = 0;
        local_148.n[3] = 0;
        local_148.n[0] = 1;
        local_148.n[1] = 0;
      }
    }
    pcStack_1c0 = (code *)0x120956;
    secp256k1_fe_sqr((secp256k1_fe *)local_1a8,&local_118);
    psVar16 = &local_60;
    pcStack_1c0 = (code *)0x12096c;
    secp256k1_fe_mul(psVar16,(secp256k1_fe *)local_1a8,&local_118);
    pcStack_1c0 = (code *)0x120974;
    secp256k1_fe_verify(psVar16);
    local_60.n[0] = local_60.n[0] + 7;
    local_60.magnitude = local_60.magnitude + 1;
    local_60.normalized = 0;
    pcStack_1c0 = (code *)0x12098d;
    secp256k1_fe_verify(psVar16);
    local_e8.normalized = local_60.normalized;
    local_e8.magnitude = local_60.magnitude;
    t = &local_e8;
    local_e8.n[4] = local_60.n[4];
    local_e8.n[2] = local_60.n[2];
    local_e8.n[3] = local_60.n[3];
    local_e8.n[0] = local_60.n[0];
    local_e8.n[1] = local_60.n[1];
    pcStack_1c0 = (code *)0x1209ba;
    secp256k1_fe_verify(t);
    psVar15 = &local_148;
    pcStack_1c0 = (code *)0x1209c7;
    secp256k1_fe_verify(psVar15);
    if (local_148.magnitude + local_e8.magnitude < 0x21) break;
    pcStack_1c0 = (code *)0x120f22;
    secp256k1_ellswift_xswiftec_frac_var_cold_7();
LAB_00120f22:
    local_118.n[4] = 0;
    local_118.magnitude = 1;
    local_118.normalized = 1;
    local_118.n[2] = 0;
    local_118.n[3] = 0;
    local_118.n[0] = 1;
    local_118.n[1] = 0;
  }
  local_e8.n[0] = local_e8.n[0] + local_148.n[0];
  local_e8.n[1] = local_e8.n[1] + local_148.n[1];
  local_e8.n[2] = local_e8.n[2] + local_148.n[2];
  local_e8.n[3] = local_e8.n[3] + local_148.n[3];
  uVar5 = local_e8.n[4] + local_148.n[4];
  local_e8.normalized = 0;
  local_e8.magnitude = local_148.magnitude + local_e8.magnitude;
  pcStack_1c0 = (code *)0x120a3c;
  local_e8.n[4] = uVar5;
  local_b8 = local_e8.n[2];
  uStack_b0 = local_e8.n[3];
  local_a8 = local_e8.n[0];
  uStack_a0 = local_e8.n[1];
  secp256k1_fe_verify(&local_e8);
  pcStack_1c0 = (code *)0x120a44;
  secp256k1_fe_verify(&local_e8);
  uVar4 = local_a8 + (uVar5 >> 0x30) * 0x1000003d1;
  if (((uVar4 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar4 & 0xfffffffffffff) == 0)) {
    uVar7 = uStack_a0 + (uVar4 >> 0x34);
    uVar9 = local_b8 + (uVar7 >> 0x34);
    uVar8 = uStack_b0 + (uVar9 >> 0x34);
    uVar5 = (uVar8 >> 0x34) + (uVar5 & 0xffffffffffff);
    in_R8 = (uVar7 | uVar4 | uVar9 | uVar8) & 0xfffffffffffff | uVar5;
    if (in_R8 == 0) goto LAB_00120f88;
    in_R8 = 0x1000003d0;
    if (((uVar4 | 0x1000003d0) & uVar7 & uVar9 & uVar8 & (uVar5 ^ 0xf000000000000)) ==
        0xfffffffffffff) goto LAB_00120f88;
  }
  while( true ) {
    pcStack_1c0 = (code *)0x120b36;
    secp256k1_fe_mul(&local_90,&local_148,(secp256k1_fe *)local_1a8);
    pcStack_1c0 = (code *)0x120b3e;
    secp256k1_fe_verify(&local_90);
    if (local_90.magnitude < 0xb) break;
    pcStack_1c0 = (code *)0x120f88;
    secp256k1_ellswift_xswiftec_frac_var_cold_6();
LAB_00120f88:
    pcStack_1c0 = (code *)0x120fa2;
    secp256k1_ellswift_xswiftec_frac_var_cold_1();
  }
  local_90.magnitude = local_90.magnitude * 3;
  psVar16 = &local_90;
  local_90.n[0] = local_90.n[0] * 3;
  local_90.n[1] = local_90.n[1] * 3;
  local_90.n[2] = local_90.n[2] * 3;
  local_90.n[3] = local_90.n[3] * 3;
  r = (secp256k1_gej *)(local_90.n[4] * 3);
  local_90.normalized = 0;
  pcStack_1c0 = (code *)0x120ba4;
  local_90.n[4] = (uint64_t)r;
  secp256k1_fe_verify(psVar16);
  pcStack_1c0 = (code *)0x120bb9;
  secp256k1_fe_sqr((secp256k1_fe *)local_1a8,&local_e8);
  pcStack_1c0 = (code *)0x120bc1;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  pcStack_1c0 = (code *)0x120bce;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)local_1a8,1);
  local_1a8._0_8_ = 0x3ffffbfffff0bc - local_1a8._0_8_;
  local_1a8._8_8_ = 0x3ffffffffffffc - local_1a8._8_8_;
  local_1a8._16_8_ = 0x3ffffffffffffc - local_1a8._16_8_;
  local_1a8._24_8_ = 0x3ffffffffffffc - local_1a8._24_8_;
  local_1a8._32_8_ = 0x3fffffffffffc - local_1a8._32_8_;
  local_1a8._40_4_ = 2;
  local_1a8._44_4_ = 0;
  pcStack_1c0 = (code *)0x120c1d;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  psVar15 = (secp256k1_fe *)(local_1a8 + 0x30);
  pcStack_1c0 = (code *)0x120c35;
  a_00 = psVar16;
  secp256k1_fe_mul(psVar15,psVar16,&local_118);
  pcStack_1c0 = (code *)0x120c3d;
  secp256k1_fe_verify(psVar15);
  pcStack_1c0 = (code *)0x120c45;
  r_00 = (secp256k1_gej *)local_1a8;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  if (local_1a8._40_4_ + iStack_150 < 0x21) {
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168 = local_168 + local_1a8._16_8_;
    uStack_160 = uStack_160 + local_1a8._24_8_;
    local_158 = (long)((secp256k1_fe *)local_1a8._32_8_)->n + local_158;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x120c9b;
    r = (secp256k1_gej *)local_1a8._32_8_;
    iStack_150 = local_1a8._40_4_ + iStack_150;
    secp256k1_fe_verify((secp256k1_fe *)(local_1a8 + 0x30));
    pcStack_1c0 = (code *)0x120cab;
    iVar3 = secp256k1_ge_x_frac_on_curve_var((secp256k1_fe *)(local_1a8 + 0x30),&local_90);
    if (iVar3 != 0) {
      (local_1b0->x).n[4] = local_158;
      (local_1b0->x).magnitude = iStack_150;
      (local_1b0->x).normalized = iStack_14c;
      (local_1b0->x).n[2] = local_168;
      (local_1b0->x).n[3] = uStack_160;
      (local_1b0->x).n[0] = local_1a8._48_8_;
      (local_1b0->x).n[1] = uStack_170;
      xd->n[4] = local_90.n[4];
      xd->magnitude = local_90.magnitude;
      xd->normalized = local_90.normalized;
      xd->n[2] = local_90.n[2];
      xd->n[3] = local_90.n[3];
      xd->n[0] = local_90.n[0];
      xd->n[1] = local_90.n[1];
      return;
    }
    xd->n[4] = local_e8.n[4];
    xd->magnitude = local_e8.magnitude;
    xd->normalized = local_e8.normalized;
    xd->n[2] = local_e8.n[2];
    xd->n[3] = local_e8.n[3];
    xd->n[0] = local_e8.n[0];
    xd->n[1] = local_e8.n[1];
    xd = (secp256k1_fe *)local_1a8;
    pcStack_1c0 = (code *)0x120d3c;
    secp256k1_fe_mul(xd,&secp256k1_ellswift_c1,&local_148);
    a_00 = &secp256k1_ellswift_c2;
    psVar16 = (secp256k1_fe *)(local_1a8 + 0x30);
    pcStack_1c0 = (code *)0x120d58;
    secp256k1_fe_mul(psVar16,&secp256k1_ellswift_c2,&local_60);
    pcStack_1c0 = (code *)0x120d60;
    secp256k1_fe_verify(psVar16);
    pcStack_1c0 = (code *)0x120d68;
    r_00 = (secp256k1_gej *)xd;
    secp256k1_fe_verify(xd);
    if (0x20 < local_1a8._40_4_ + iStack_150) goto LAB_00120fac;
    psVar16 = (secp256k1_fe *)(local_1a8 + 0x30);
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168 = local_168 + local_1a8._16_8_;
    uStack_160 = uStack_160 + local_1a8._24_8_;
    local_158 = (long)((secp256k1_fe *)local_1a8._32_8_)->n + local_158;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x120dbd;
    r = (secp256k1_gej *)local_1a8._32_8_;
    iStack_150 = local_1a8._40_4_ + iStack_150;
    secp256k1_fe_verify(psVar16);
    pcStack_1c0 = (code *)0x120dd0;
    secp256k1_fe_mul(psVar16,psVar16,&local_118);
    pcStack_1c0 = (code *)0x120de0;
    iVar3 = secp256k1_ge_x_frac_on_curve_var(psVar16,&local_e8);
    if (iVar3 != 0) {
      (local_1b0->x).n[4] = local_158;
      (local_1b0->x).magnitude = iStack_150;
      (local_1b0->x).normalized = iStack_14c;
      (local_1b0->x).n[2] = local_168;
      (local_1b0->x).n[3] = uStack_160;
      (local_1b0->x).n[0] = local_1a8._48_8_;
      (local_1b0->x).n[1] = uStack_170;
      return;
    }
    xd = (secp256k1_fe *)local_1a8;
    a_00 = &local_e8;
    pcStack_1c0 = (code *)0x120e29;
    secp256k1_fe_mul(xd,a_00,&local_118);
    psVar16 = (secp256k1_fe *)(local_1a8 + 0x30);
    pcStack_1c0 = (code *)0x120e36;
    secp256k1_fe_verify(psVar16);
    pcStack_1c0 = (code *)0x120e3e;
    r_00 = (secp256k1_gej *)xd;
    secp256k1_fe_verify(xd);
    if (0x20 < local_1a8._40_4_ + iStack_150) goto LAB_00120fb1;
    xd = (secp256k1_fe *)(local_1a8 + 0x30);
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168 = local_168 + local_1a8._16_8_;
    uStack_160 = uStack_160 + local_1a8._24_8_;
    local_158 = (long)((secp256k1_fe *)local_1a8._32_8_)->n + local_158;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x120e93;
    r = (secp256k1_gej *)local_1a8._32_8_;
    iStack_150 = local_1a8._40_4_ + iStack_150;
    secp256k1_fe_verify(xd);
    pcStack_1c0 = (code *)0x120e9b;
    secp256k1_fe_verify(xd);
    pcStack_1c0 = (code *)0x120ea8;
    secp256k1_fe_verify_magnitude(xd,2);
    psVar6 = local_1b0;
    (local_1b0->x).n[0] = 0x5ffff9ffffe91a - local_1a8._48_8_;
    (local_1b0->x).n[1] = 0x5ffffffffffffa - uStack_170;
    (local_1b0->x).n[2] = 0x5ffffffffffffa - local_168;
    (local_1b0->x).n[3] = 0x5ffffffffffffa - uStack_160;
    (local_1b0->x).n[4] = 0x5fffffffffffa - local_158;
    (local_1b0->x).magnitude = 3;
    (local_1b0->x).normalized = 0;
    pcStack_1c0 = (code *)0x120ef3;
    secp256k1_fe_verify(&local_1b0->x);
    a_00 = &local_e8;
    pcStack_1c0 = (code *)0x120f03;
    r_00 = psVar6;
    iVar3 = secp256k1_ge_x_frac_on_curve_var(&psVar6->x,a_00);
    if (iVar3 != 0) {
      return;
    }
  }
  else {
    pcStack_1c0 = (code *)0x120fac;
    secp256k1_ellswift_xswiftec_frac_var_cold_5();
LAB_00120fac:
    pcStack_1c0 = (code *)0x120fb1;
    secp256k1_ellswift_xswiftec_frac_var_cold_4();
LAB_00120fb1:
    pcStack_1c0 = (code *)0x120fb6;
    secp256k1_ellswift_xswiftec_frac_var_cold_3();
  }
  pcStack_1c0 = secp256k1_ecmult_const_xonly;
  secp256k1_ellswift_xswiftec_frac_var_cold_2();
  pcStack_1c0 = (code *)0xfffffffffffff;
  r_02 = (secp256k1_gej *)auStack_350;
  psStack_368 = (secp256k1_gej *)0x120fe8;
  psStack_1e8 = psVar6;
  psStack_1e0 = (secp256k1_gej *)local_1a8;
  psStack_1d8 = psVar15;
  psStack_1d0 = (secp256k1_gej *)xd;
  psStack_1c8 = psVar16;
  secp256k1_fe_sqr((secp256k1_fe *)r_02,a_00);
  psStack_368 = (secp256k1_gej *)0x120ff6;
  secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,a_00);
  psStack_358 = r_00;
  if (a == (secp256k1_fe *)0x0) {
    psStack_368 = (secp256k1_gej *)0x1211f0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_350);
    auStack_350._0_8_ = auStack_350._0_8_ + 7;
    auStack_350._40_4_ = auStack_350._40_4_ + 1;
    auStack_350._44_4_ = 0;
    psStack_368 = (secp256k1_gej *)0x121206;
    secp256k1_fe_verify((secp256k1_fe *)auStack_350);
    if ((int)in_R8 == 0) {
      r_01 = (secp256k1_ge *)auStack_350;
LAB_0012120f:
      psStack_368 = (secp256k1_gej *)0x121214;
      iVar3 = secp256k1_fe_is_square_var(&r_01->x);
      if (iVar3 == 0) {
        return;
      }
    }
LAB_0012121c:
    r_00 = (secp256k1_gej *)auStack_350;
    psStack_368 = (secp256k1_gej *)0x121234;
    secp256k1_fe_mul(&sStack_250.x,(secp256k1_fe *)r_00,a_00);
    a_00 = &sStack_250.y;
    psStack_368 = (secp256k1_gej *)0x121247;
    secp256k1_fe_sqr(a_00,(secp256k1_fe *)r_00);
    sStack_250.infinity = 0;
    psStack_368 = (secp256k1_gej *)0x121258;
    psVar6 = r;
    secp256k1_scalar_verify((secp256k1_scalar *)r);
    auVar17._0_4_ = -(uint)((int)(r->x).n[2] == 0 && (int)(r->x).n[0] == 0);
    auVar17._4_4_ =
         -(uint)(*(int *)((long)(r->x).n + 0x14) == 0 && *(int *)((long)(r->x).n + 4) == 0);
    auVar17._8_4_ = -(uint)((int)(r->x).n[3] == 0 && (int)(r->x).n[1] == 0);
    auVar17._12_4_ =
         -(uint)(*(int *)((long)(r->x).n + 0x1c) == 0 && *(int *)((long)(r->x).n + 0xc) == 0);
    iVar3 = movmskps(extraout_EAX,auVar17);
    if (iVar3 == 0xf) {
      psStack_368 = (secp256k1_gej *)0x121320;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      r_00 = (secp256k1_gej *)(auStack_350 + 0x60);
      psStack_368 = (secp256k1_gej *)0x121293;
      secp256k1_ecmult_const(r_00,&sStack_250,(secp256k1_scalar *)r);
      psStack_368 = (secp256k1_gej *)0x12129b;
      psVar6 = r_00;
      secp256k1_gej_verify(r_00);
      if (iStack_260 == 0) {
        psVar15 = (secp256k1_fe *)(auStack_350 + 0x30);
        psStack_368 = (secp256k1_gej *)0x1212b9;
        secp256k1_fe_sqr(psVar15,&sStack_290);
        psStack_368 = (secp256k1_gej *)0x1212c9;
        secp256k1_fe_mul(psVar15,psVar15,(secp256k1_fe *)auStack_350);
        if (a != (secp256k1_fe *)0x0) {
          psStack_368 = (secp256k1_gej *)0x1212de;
          secp256k1_fe_mul((secp256k1_fe *)(auStack_350 + 0x30),(secp256k1_fe *)(auStack_350 + 0x30)
                           ,a);
        }
        psVar15 = (secp256k1_fe *)(auStack_350 + 0x30);
        psStack_368 = (secp256k1_gej *)0x1212ee;
        secp256k1_fe_inv(psVar15,psVar15);
        psStack_368 = (secp256k1_gej *)0x121300;
        secp256k1_fe_mul(&psStack_358->x,(secp256k1_fe *)(auStack_350 + 0x60),psVar15);
        return;
      }
    }
    psStack_368 = (secp256k1_gej *)0x121325;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00121325:
    psStack_368 = (secp256k1_gej *)0x12132a;
    secp256k1_ecmult_const_xonly_cold_1();
  }
  else {
    psStack_368 = (secp256k1_gej *)0x12100c;
    secp256k1_fe_verify(a);
    uVar4 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
    uVar5 = (uVar4 >> 0x34) + a->n[1];
    uVar7 = (uVar5 >> 0x34) + a->n[2];
    psVar6 = (secp256k1_gej *)((uVar7 >> 0x34) + a->n[3]);
    uVar9 = ((ulong)psVar6 >> 0x34) + (a->n[4] & 0xffffffffffff);
    if ((((uVar5 | uVar4 | uVar7 | (ulong)psVar6) & 0xfffffffffffff) == 0 && uVar9 == 0) ||
       (((uVar4 ^ 0x1000003d0) & uVar5 & uVar7 & (ulong)psVar6 & (uVar9 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_00121325;
    r_02 = (secp256k1_gej *)(auStack_350 + 0x60);
    psStack_368 = (secp256k1_gej *)0x1210b8;
    secp256k1_fe_sqr((secp256k1_fe *)r_02,a);
    psStack_368 = (secp256k1_gej *)0x1210c0;
    psVar6 = r_02;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    if (iStack_2c8 < 5) {
      iStack_2c8 = iStack_2c8 * 7;
      r_02 = (secp256k1_gej *)(auStack_350 + 0x60);
      auStack_350._96_8_ = auStack_350._96_8_ * 7;
      uStack_2e8 = uStack_2e8 * 7;
      uStack_2e0 = uStack_2e0 * 7;
      uStack_2d8 = uStack_2d8 * 7;
      uStack_2d0 = uStack_2d0 * 7;
      iStack_2c4 = 0;
      psStack_368 = (secp256k1_gej *)0x12114e;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_368 = (secp256k1_gej *)0x12115c;
      secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,a);
      r_00 = (secp256k1_gej *)auStack_350;
      psStack_368 = (secp256k1_gej *)0x121169;
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      psStack_368 = (secp256k1_gej *)0x121171;
      psVar6 = r_02;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      if (0x20 < iStack_2c8 + auStack_350._40_4_) goto LAB_0012132f;
      auStack_350._0_8_ = auStack_350._0_8_ + auStack_350._96_8_;
      auStack_350._8_8_ = auStack_350._8_8_ + uStack_2e8;
      auStack_350._16_8_ = auStack_350._16_8_ + uStack_2e0;
      auStack_350._24_8_ = auStack_350._24_8_ + uStack_2d8;
      auStack_350._32_8_ = auStack_350._32_8_ + uStack_2d0;
      auStack_350._44_4_ = 0;
      psStack_368 = (secp256k1_gej *)0x1211c2;
      auStack_350._40_4_ = iStack_2c8 + auStack_350._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)auStack_350);
      if ((int)in_R8 == 0) {
        r_01 = &sStack_250;
        psStack_368 = (secp256k1_gej *)0x1211de;
        secp256k1_fe_mul(&r_01->x,(secp256k1_fe *)auStack_350,a);
        goto LAB_0012120f;
      }
      goto LAB_0012121c;
    }
  }
  psStack_368 = (secp256k1_gej *)0x12132f;
  secp256k1_ecmult_const_xonly_cold_3();
LAB_0012132f:
  psStack_368 = (secp256k1_gej *)secp256k1_fe_normalize;
  secp256k1_ecmult_const_xonly_cold_2();
  pcStack_380 = (code *)0x121355;
  psStack_378 = r_00;
  psStack_368 = r;
  secp256k1_fe_verify(&psVar6->x);
  uVar4 = (psVar6->x).n[4];
  uVar5 = (uVar4 >> 0x30) * 0x1000003d1 + (psVar6->x).n[0];
  uVar9 = (uVar5 >> 0x34) + (psVar6->x).n[1];
  uVar7 = (uVar9 >> 0x34) + (psVar6->x).n[2];
  uVar8 = uVar7 & 0xfffffffffffff;
  uVar7 = (uVar7 >> 0x34) + (psVar6->x).n[3];
  uVar4 = (uVar7 >> 0x34) + (uVar4 & 0xffffffffffff);
  uVar5 = uVar5 & 0xfffffffffffff;
  uVar13 = (ulong)(0xffffefffffc2e < uVar5 &&
                  ((uVar8 & uVar9 & uVar7) == 0xfffffffffffff && uVar4 == 0xffffffffffff)) |
           uVar4 >> 0x30;
  uVar5 = uVar13 * 0x1000003d1 + uVar5;
  uVar9 = (uVar5 >> 0x34) + (uVar9 & 0xfffffffffffff);
  sig = (secp256k1_ecdsa_signature *)((uVar9 >> 0x34) + uVar8);
  ctx = (secp256k1_context *)(((ulong)sig >> 0x34) + (uVar7 & 0xfffffffffffff));
  uVar4 = ((ulong)ctx >> 0x34) + uVar4;
  uVar7 = uVar4 >> 0x30;
  if ((uint)(ushort)(uVar4 >> 0x30) == (uint)uVar13) {
    (psVar6->x).n[0] = uVar5 & 0xfffffffffffff;
    (psVar6->x).n[1] = uVar9 & 0xfffffffffffff;
    (psVar6->x).n[2] = (ulong)sig & 0xfffffffffffff;
    (psVar6->x).n[3] = (ulong)ctx & 0xfffffffffffff;
    (psVar6->x).n[4] = uVar4 & 0xffffffffffff;
    (psVar6->x).magnitude = 1;
    (psVar6->x).normalized = 1;
    secp256k1_fe_verify(&psVar6->x);
    return;
  }
  pcStack_380 = ecdsa_signature_parse_der_lax;
  secp256k1_fe_normalize_cold_1();
  uStack_388 = 0xfffffffffffff;
  uStack_390 = 0xffffffffffff;
  auStack_3f0[0x30] = '\0';
  auStack_3f0[0x31] = '\0';
  auStack_3f0[0x32] = '\0';
  auStack_3f0[0x33] = '\0';
  auStack_3f0[0x34] = '\0';
  auStack_3f0[0x35] = '\0';
  auStack_3f0[0x36] = '\0';
  auStack_3f0[0x37] = '\0';
  auStack_3f0[0x38] = '\0';
  auStack_3f0[0x39] = '\0';
  auStack_3f0[0x3a] = '\0';
  auStack_3f0[0x3b] = '\0';
  auStack_3f0[0x3c] = '\0';
  auStack_3f0[0x3d] = '\0';
  auStack_3f0[0x3e] = '\0';
  auStack_3f0[0x3f] = '\0';
  auStack_3f0[0x20] = '\0';
  auStack_3f0[0x21] = '\0';
  auStack_3f0[0x22] = '\0';
  auStack_3f0[0x23] = '\0';
  auStack_3f0[0x24] = '\0';
  auStack_3f0[0x25] = '\0';
  auStack_3f0[0x26] = '\0';
  auStack_3f0[0x27] = '\0';
  auStack_3f0[0x28] = '\0';
  auStack_3f0[0x29] = '\0';
  auStack_3f0[0x2a] = '\0';
  auStack_3f0[0x2b] = '\0';
  auStack_3f0[0x2c] = '\0';
  auStack_3f0[0x2d] = '\0';
  auStack_3f0[0x2e] = '\0';
  auStack_3f0[0x2f] = '\0';
  auStack_3f0[0x10] = '\0';
  auStack_3f0[0x11] = '\0';
  auStack_3f0[0x12] = '\0';
  auStack_3f0[0x13] = '\0';
  auStack_3f0[0x14] = '\0';
  auStack_3f0[0x15] = '\0';
  auStack_3f0[0x16] = '\0';
  auStack_3f0[0x17] = '\0';
  auStack_3f0[0x18] = '\0';
  auStack_3f0[0x19] = '\0';
  auStack_3f0[0x1a] = '\0';
  auStack_3f0[0x1b] = '\0';
  auStack_3f0[0x1c] = '\0';
  auStack_3f0[0x1d] = '\0';
  auStack_3f0[0x1e] = '\0';
  auStack_3f0[0x1f] = '\0';
  auStack_3f0[0] = '\0';
  auStack_3f0[1] = '\0';
  auStack_3f0[2] = '\0';
  auStack_3f0[3] = '\0';
  auStack_3f0[4] = '\0';
  auStack_3f0[5] = '\0';
  auStack_3f0[6] = '\0';
  auStack_3f0[7] = '\0';
  auStack_3f0[8] = '\0';
  auStack_3f0[9] = '\0';
  auStack_3f0[10] = '\0';
  auStack_3f0[0xb] = '\0';
  auStack_3f0[0xc] = '\0';
  auStack_3f0[0xd] = '\0';
  auStack_3f0[0xe] = '\0';
  auStack_3f0[0xf] = '\0';
  psStack_3a8 = psVar6;
  psStack_3a0 = a_00;
  psStack_398 = r_02;
  pcStack_380 = (code *)(in_R8 & 0xffffffff);
  secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_3f0);
  if (((uVar7 != 0) && (uVar7 != 1)) && (*extraout_RDX == '0')) {
    bVar1 = extraout_RDX[1];
    uVar4 = 2;
    if ((char)bVar1 < '\0') {
      if (uVar7 - 2 < (ulong)bVar1 - 0x80) {
        return;
      }
      uVar4 = (ulong)bVar1 - 0x7e;
    }
    if (((uVar4 != uVar7) && (extraout_RDX[uVar4] == '\x02')) && (uVar4 + 1 != uVar7)) {
      lVar14 = uVar4 + 2;
      uVar5 = (ulong)(byte)extraout_RDX[uVar4 + 1];
      if (extraout_RDX[uVar4 + 1] < '\0') {
        uVar9 = uVar5 - 0x80;
        if (uVar7 - lVar14 < uVar9) {
          return;
        }
        if (uVar9 != 0) {
          lVar10 = uVar4 + uVar5 + -0x7e;
          uVar5 = 0;
          lVar12 = 0;
          pcVar11 = extraout_RDX;
LAB_001215b1:
          if (pcVar11[lVar14] == '\0') goto code_r0x001215b8;
          if (7 < uVar9 + lVar12) {
            return;
          }
          uVar4 = -lVar12;
          uVar5 = 0;
          do {
            uVar5 = (ulong)(byte)extraout_RDX[uVar4 + lVar14] | uVar5 << 8;
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
          lVar14 = (lVar14 - lVar12) + uVar9 + lVar12;
          goto LAB_00121518;
        }
        uVar5 = 0;
        lVar10 = lVar14;
      }
      else {
LAB_00121518:
        lVar10 = lVar14;
        if (uVar7 - lVar14 < uVar5) {
          return;
        }
      }
LAB_00121523:
      uVar4 = lVar10 + uVar5;
      if (((uVar4 != uVar7) && (extraout_RDX[uVar4] == '\x02')) && (uVar4 + 1 != uVar7)) {
        lVar14 = uVar4 + 2;
        uVar9 = (ulong)(byte)extraout_RDX[uVar4 + 1];
        if (extraout_RDX[uVar4 + 1] < '\0') {
          uVar8 = uVar9 - 0x80;
          if (uVar7 - lVar14 < uVar8) {
            return;
          }
          if (uVar8 != 0) {
            lVar12 = uVar4 + uVar9 + -0x7e;
            uVar9 = 0;
            uVar4 = 0;
LAB_0012163b:
            if (extraout_RDX[uVar4 + lVar14] == '\0') goto code_r0x00121646;
            uVar13 = uVar8 - uVar4;
            if (7 < uVar13) {
              return;
            }
            lVar12 = lVar14 + uVar4;
            uVar9 = 0;
            do {
              uVar9 = (ulong)(byte)extraout_RDX[uVar4 + lVar14] | uVar9 << 8;
              uVar4 = uVar4 + 1;
            } while (uVar8 != uVar4);
            lVar14 = lVar12 + uVar13;
            goto LAB_0012154f;
          }
          uVar9 = 0;
          lVar12 = lVar14;
        }
        else {
LAB_0012154f:
          lVar12 = lVar14;
          if (uVar7 - lVar14 < uVar9) {
            return;
          }
        }
LAB_00121557:
        bVar2 = true;
        if (uVar5 != 0) {
          uVar4 = 0;
          do {
            if (extraout_RDX[uVar4 + lVar10] != '\0') {
              if (uVar5 - uVar4 < 0x21) {
                memcpy(auStack_3f0 + (uVar4 - uVar5) + 0x20,extraout_RDX + uVar4 + lVar10,
                       uVar5 - uVar4);
              }
              else {
                bVar2 = false;
              }
              break;
            }
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
        if (uVar9 != 0) {
          uVar4 = 0;
          do {
            if (extraout_RDX[uVar4 + lVar12] != '\0') {
              if (0x20 < uVar9 - uVar4) goto LAB_001216e7;
              memcpy(auStack_3f0 + (uVar4 - uVar9) + 0x40,extraout_RDX + uVar4 + lVar12,
                     uVar9 - uVar4);
              break;
            }
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
        }
        if ((!bVar2) ||
           (iVar3 = secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_3f0), iVar3 == 0)) {
LAB_001216e7:
          auStack_3f0[0x30] = '\0';
          auStack_3f0[0x31] = '\0';
          auStack_3f0[0x32] = '\0';
          auStack_3f0[0x33] = '\0';
          auStack_3f0[0x34] = '\0';
          auStack_3f0[0x35] = '\0';
          auStack_3f0[0x36] = '\0';
          auStack_3f0[0x37] = '\0';
          auStack_3f0[0x38] = '\0';
          auStack_3f0[0x39] = '\0';
          auStack_3f0[0x3a] = '\0';
          auStack_3f0[0x3b] = '\0';
          auStack_3f0[0x3c] = '\0';
          auStack_3f0[0x3d] = '\0';
          auStack_3f0[0x3e] = '\0';
          auStack_3f0[0x3f] = '\0';
          auStack_3f0[0x20] = '\0';
          auStack_3f0[0x21] = '\0';
          auStack_3f0[0x22] = '\0';
          auStack_3f0[0x23] = '\0';
          auStack_3f0[0x24] = '\0';
          auStack_3f0[0x25] = '\0';
          auStack_3f0[0x26] = '\0';
          auStack_3f0[0x27] = '\0';
          auStack_3f0[0x28] = '\0';
          auStack_3f0[0x29] = '\0';
          auStack_3f0[0x2a] = '\0';
          auStack_3f0[0x2b] = '\0';
          auStack_3f0[0x2c] = '\0';
          auStack_3f0[0x2d] = '\0';
          auStack_3f0[0x2e] = '\0';
          auStack_3f0[0x2f] = '\0';
          auStack_3f0[0x10] = '\0';
          auStack_3f0[0x11] = '\0';
          auStack_3f0[0x12] = '\0';
          auStack_3f0[0x13] = '\0';
          auStack_3f0[0x14] = '\0';
          auStack_3f0[0x15] = '\0';
          auStack_3f0[0x16] = '\0';
          auStack_3f0[0x17] = '\0';
          auStack_3f0[0x18] = '\0';
          auStack_3f0[0x19] = '\0';
          auStack_3f0[0x1a] = '\0';
          auStack_3f0[0x1b] = '\0';
          auStack_3f0[0x1c] = '\0';
          auStack_3f0[0x1d] = '\0';
          auStack_3f0[0x1e] = '\0';
          auStack_3f0[0x1f] = '\0';
          auStack_3f0[0] = '\0';
          auStack_3f0[1] = '\0';
          auStack_3f0[2] = '\0';
          auStack_3f0[3] = '\0';
          auStack_3f0[4] = '\0';
          auStack_3f0[5] = '\0';
          auStack_3f0[6] = '\0';
          auStack_3f0[7] = '\0';
          auStack_3f0[8] = '\0';
          auStack_3f0[9] = '\0';
          auStack_3f0[10] = '\0';
          auStack_3f0[0xb] = '\0';
          auStack_3f0[0xc] = '\0';
          auStack_3f0[0xd] = '\0';
          auStack_3f0[0xe] = '\0';
          auStack_3f0[0xf] = '\0';
          secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_3f0);
        }
      }
    }
  }
  return;
code_r0x001215b8:
  lVar12 = lVar12 + -1;
  pcVar11 = pcVar11 + 1;
  if (uVar9 + lVar12 == 0) goto LAB_00121523;
  goto LAB_001215b1;
code_r0x00121646:
  uVar4 = uVar4 + 1;
  if (uVar8 == uVar4) goto LAB_00121557;
  goto LAB_0012163b;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}